

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiowrt.c
# Opt level: O3

void fiowrtobj(void *ctx0,toksdef *t)

{
  byte bVar1;
  ushort objnum;
  uint uVar2;
  mcmcxdef *ctx;
  errcxdef *ec;
  FILE *__stream;
  uint32_t tmp_3;
  long lVar3;
  uchar *__ptr;
  size_t sVar4;
  size_t sVar5;
  uint16_t tmp_1;
  uint16_t tmp_2;
  int e;
  uint siz;
  int iVar6;
  uint16_t tmp;
  ulong __size;
  uchar buf [89];
  uchar *local_b0;
  byte local_98;
  ushort local_97;
  undefined2 local_95;
  undefined2 local_93;
  undefined4 local_91;
  
  ctx = *ctx0;
  ec = *(errcxdef **)((long)ctx0 + 8);
  __stream = *(FILE **)((long)ctx0 + 0x10);
  uVar2 = *(uint *)((long)ctx0 + 0x18);
  lVar3 = ftell(__stream);
  local_98 = t->tokstyp;
  objnum = t->toksval;
  if (9 < local_98 - 1) {
    return;
  }
  local_97 = objnum;
  switch((uint)local_98) {
  case 1:
    local_b0 = mcmlck(ctx,objnum);
    local_95 = *(ushort *)
                ((long)&ctx->mcmcxgl->mcmcxtab[ctx->mcmcxmtb[objnum >> 8][objnum & 0xff] >> 8]->
                        mcmosiz + (ulong)((ctx->mcmcxmtb[objnum >> 8][objnum & 0xff] & 0xff) << 5));
    siz = (uint)local_95;
    break;
  case 2:
    objcomp(ctx,objnum,*(int *)((long)ctx0 + 0x30));
    local_b0 = mcmlck(ctx,objnum);
    local_95 = *(ushort *)
                ((long)&ctx->mcmcxgl->mcmcxtab[ctx->mcmcxmtb[objnum >> 8][objnum & 0xff] >> 8]->
                        mcmosiz + (ulong)((ctx->mcmcxmtb[objnum >> 8][objnum & 0xff] & 0xff) << 5));
    siz = (uint)*(ushort *)(local_b0 + 8);
    if ((local_b0[2] & 2) != 0) {
      siz = siz + (uint)*(ushort *)(local_b0 + 6) * 4;
    }
    break;
  default:
    goto switchD_001191b6_caseD_3;
  case 7:
  case 8:
    if ((uVar2 & 0x10) == 0) {
      sup_log_undefobj(ctx,ec,(local_98 != 8) + 0x25b,t->toksnam,(uint)t->tokslen,objnum);
      *(int *)((long)ctx0 + 0x1c) = *(int *)((long)ctx0 + 0x1c) + 1;
      mcmfre(ctx,objnum);
      return;
    }
    __ptr = mcmlck(ctx,objnum);
    local_95 = *(ushort *)
                ((long)&ctx->mcmcxgl->mcmcxtab[ctx->mcmcxmtb[objnum >> 8][objnum & 0xff] >> 8]->
                        mcmosiz + (ulong)((ctx->mcmcxmtb[objnum >> 8][objnum & 0xff] & 0xff) << 5));
    __size = (ulong)local_95;
    sVar4 = fwrite(&local_98,5,1,__stream);
    e = 0x259;
    if ((sVar4 == 1) && (sVar4 = fwrite(__ptr,__size,1,__stream), sVar4 == 1)) {
      return;
    }
    goto LAB_00119490;
  case 10:
    bVar1 = t->tokslen;
    local_95 = CONCAT11(local_95._1_1_,bVar1);
    memcpy((void *)((long)&local_95 + 1),t->toksnam,(ulong)bVar1);
    sVar4 = fwrite(&local_98,(ulong)bVar1 + 4,1,__stream);
    e = 0x259;
    iVar6 = 0;
    if (sVar4 != 1) {
      iVar6 = 0x259;
    }
    if ((*(FILE **)((long)ctx0 + 0x20) != (FILE *)0x0) &&
       (sVar4 = fwrite(&local_98,(ulong)t->tokslen + 4,1,*(FILE **)((long)ctx0 + 0x20)), sVar4 != 1)
       ) goto LAB_00119490;
    goto LAB_00119476;
  }
  local_93 = (undefined2)siz;
  sVar4 = fwrite(&local_98,7,1,__stream);
  if ((uVar2 & 8) != 0) {
    fioxor(local_b0,siz,*(uint *)((long)ctx0 + 0x28),*(uint *)((long)ctx0 + 0x2c));
  }
  sVar5 = fwrite(local_b0,(ulong)siz,1,__stream);
  iVar6 = 0;
  if (sVar5 != 1 || sVar4 != 1) {
    iVar6 = 0x259;
  }
  if (*(FILE **)((long)ctx0 + 0x20) != (FILE *)0x0) {
    local_91 = (undefined4)lVar3;
    sVar4 = fwrite(&local_98,0xb,1,*(FILE **)((long)ctx0 + 0x20));
    if (sVar4 != 1) {
      iVar6 = 0x259;
    }
  }
  mcmunlck(ctx,objnum);
  mcmfre(ctx,objnum);
LAB_00119476:
  e = iVar6;
  if (iVar6 != 0) {
LAB_00119490:
    errsigf(ec,"TADS",e);
  }
switchD_001191b6_caseD_3:
  return;
}

Assistant:

static void fiowrtobj(void *ctx0, toksdef *t)
{
    fiowcxdef *ctx = (fiowcxdef *)ctx0;
    uchar      buf[TOKNAMMAX + 50];
    mcmon      obj;
    mcmcxdef  *mctx = ctx->fiowcxmem;
    errcxdef  *ec = ctx->fiowcxerr;
    osfildef  *fp = ctx->fiowcxfp;
    uint       flags = ctx->fiowcxflg;
    uchar     *p;
    uint       siz;
    uint       used;
    int        err = 0;
    ulong      startpos = osfpos(fp);
    
    /* set up start of buffer to write */
    buf[0] = t->tokstyp;
    obj = t->toksval;
    oswp2(buf + 1, obj);
    
    switch(t->tokstyp)
    {
    case TOKSTOBJ:
        /* 
         *   Mark object as finished with compilation.  Note that we must
         *   do this even though tcdmain() does this as well, because
         *   running preinit() might have updated properties since the
         *   last time we marked objects.  
         */
        objcomp(mctx, (objnum)obj, ctx->fiowcxdebug);

        /* get the object's size information */
        p = mcmlck(mctx, (mcmon)obj);
        siz = mcmobjsiz(mctx, (mcmon)obj);         /* size in cache */
        used = objfree(p);          /* size actually used in object */
        if (objflg(p) & OBJFINDEX) used += objnprop(p) * 4;
        goto write_func_or_obj;
                
    case TOKSTFUNC:
        /* size of function is entire object */
        p = mcmlck(mctx, (mcmon)obj);
        siz = used = mcmobjsiz(mctx, (mcmon)obj);

    write_func_or_obj:
        /* write type(OBJ) + objnum + size + sizeused */
        oswp2(buf+3, siz);
        oswp2(buf+5, used);
        if (osfwb(fp, buf, 7)) err = ERR_WRTGAM;
                
        /* write contents of object */
        if (flags & FIOFCRYPT)
            fioxor(p, used, ctx->fiowcxseed, ctx->fiowcxinc);
        if (osfwb(fp, p, used)) err = ERR_WRTGAM;
        
        /* write fast-load record if applicable */
        if (ctx->fiowcxffp)
        {
            oswp4(buf + 7, startpos);
            if (osfwb(ctx->fiowcxffp, buf, 11)) err = ERR_WRTGAM;
        }
                
        /*
         *   We're done with the object - delete it so that
         *   it doesn't have to be swapped out (which would
         *   be pointless, since we'll never need it again).
         */
        mcmunlck(mctx, (mcmon)obj);
        mcmfre(mctx, (mcmon)obj);
        break;
                
    case TOKSTEXTERN:
        /* all we must write is the name & number of ext func */
        buf[3] = t->tokslen;
        memcpy(buf + 4, t->toksnam, (size_t)t->tokslen);
        if (osfwb(fp, buf, t->tokslen + 4)) err = ERR_WRTGAM;
        
        /* write fast-load record if applicable */
        if (ctx->fiowcxffp
            && osfwb(ctx->fiowcxffp, buf, t->tokslen + 4)) err = ERR_WRTGAM;
        break;
                
    case TOKSTFWDOBJ:
    case TOKSTFWDFN:
        {
            int  e = (t->tokstyp == TOKSTFWDFN ? ERR_UNDEFF : ERR_UNDEFO);

            if (flags & FIOFBIN)
            {
                /* write record for the forward reference */
                p = mcmlck(mctx, (mcmon)obj);
                siz = mcmobjsiz(mctx, (mcmon)obj);
                oswp2(buf+3, siz);
                if (osfwb(fp, buf, 5)
                    || osfwb(fp, p, siz))
                    err = ERR_WRTGAM;
            }
            else
            {
                /* log the undefined-object error */
                sup_log_undefobj(mctx, ec, e,
                                 t->toksnam, (int)t->tokslen, obj);

                /* count the undefined object */
                ++(ctx->fiowcxund);

                /*
                 *   we don't need this object any longer - delete it so
                 *   that we don't have to bother swapping it in or out
                 */
                mcmfre(mctx, (mcmon)obj);
            }
        }
        break;
    }
                    
    /* if an error occurred, signal it */
    if (err) errsig(ec, err);
}